

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedqueue.cpp
# Opt level: O1

ElementType OutQueue(LinkedQueue *LQ)

{
  ElementType EVar1;
  ostream *poVar2;
  
  if (LQ->queue->size != 0) {
    SetPosition(LQ->queue,0);
    EVar1 = GetData(LQ->queue);
    DeleteAt(LQ->queue);
    return EVar1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"OutQueue: underflowed!");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

ElementType OutQueue(LinkedQueue *LQ) {  //出队
    ElementType tmpData;
    if(!(LQ->queue)->size) {
        cout << "OutQueue: underflowed!" << endl;
        exit(1);
    }
    SetPosition(LQ->queue,0);  //当前结点位置移动到队列头
    tmpData = GetData(LQ->queue);  //保存队首结点的数据
    DeleteAt(LQ->queue);    //删除队首结点
    return tmpData;   //返回被删除的队首元素
}